

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O0

void lj_dispatch_update(global_State *g)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  GCRef GVar6;
  byte bVar7;
  byte bVar8;
  BCIns *__dest;
  byte bVar9;
  global_State *in_RDI;
  bool bVar10;
  uint32_t i_1;
  uint32_t i;
  ASMFunction f;
  ASMFunction f_funcv;
  ASMFunction f_funcf;
  ASMFunction f_loop;
  ASMFunction f_iterl;
  ASMFunction f_forl;
  ASMFunction *disp;
  uint8_t mode;
  uint8_t oldmode;
  code *local_58;
  uint local_50;
  uint local_4c;
  code *local_38;
  code *local_30;
  code *local_28;
  code *local_20;
  
  bVar1 = in_RDI->dispatchmode;
  bVar9 = 0;
  if ((in_RDI[1].gc.freed & 1) != 0) {
    bVar9 = 0x10;
  }
  bVar2 = 0;
  if (*(int *)((long)&in_RDI[1].gc.tabnum + 4) != 0) {
    bVar2 = 0x25;
  }
  bVar3 = 0;
  if ((in_RDI->hookmask & 0x80) != 0) {
    bVar3 = 0x44;
  }
  bVar7 = bVar9 | bVar2 | bVar3;
  bVar4 = 0;
  if ((in_RDI->hookmask & 0xc) != 0) {
    bVar4 = 4;
  }
  bVar10 = (in_RDI->hookmask & 1) != 0;
  bVar5 = 0;
  if ((in_RDI->hookmask & 2) != 0) {
    bVar5 = 2;
  }
  bVar8 = bVar7 | bVar4 | bVar10 | bVar5;
  if (bVar1 != bVar8) {
    __dest = &in_RDI[5].bc_cfunc_int;
    in_RDI->dispatchmode = bVar8;
    if ((bVar9 | bVar2 & 0x30) == 0x10) {
      local_20 = lj_BC_FORL;
      local_28 = lj_BC_ITERL;
      local_30 = lj_BC_LOOP;
      local_38 = lj_BC_FUNCF;
    }
    else {
      local_20 = *(code **)(in_RDI[8].gcroot + 0x18);
      local_28 = *(code **)(in_RDI[8].gcroot + 0x1e);
      local_30 = *(code **)(in_RDI[8].gcroot + 0x24);
      local_38 = lj_BC_IFUNCF;
    }
    *(code **)(in_RDI[8].gcroot + 0x16) = local_20;
    *(code **)(in_RDI[8].gcroot + 0x1c) = local_28;
    *(code **)(in_RDI[8].gcroot + 0x22) = local_30;
    if (((bVar1 ^ bVar8) & 100) == 0) {
      if ((bVar7 & 4) == 0 && bVar4 == 0) {
        *(code **)(in_RDI[6].gcroot + 6) = local_20;
        *(code **)(in_RDI[6].gcroot + 0xc) = local_28;
        *(code **)(in_RDI[6].gcroot + 0x12) = local_30;
        if (bVar5 == 0) {
          GVar6.gcptr32 = in_RDI[8].gcroot[0xb].gcptr32;
          in_RDI[6].bc_cfunc_int = in_RDI[8].gcroot[10].gcptr32;
          in_RDI[6].bc_cfunc_ext = GVar6.gcptr32;
          GVar6.gcptr32 = in_RDI[8].gcroot[0xd].gcptr32;
          in_RDI[6].cur_L = (GCRef)in_RDI[8].gcroot[0xc].gcptr32;
          in_RDI[6].mem_L = (GCRef)GVar6.gcptr32;
          GVar6.gcptr32 = in_RDI[8].gcroot[0xf].gcptr32;
          in_RDI[6].jit_base = (MRef)in_RDI[8].gcroot[0xe].gcptr32;
          in_RDI[6].ctype_state = (MRef)GVar6.gcptr32;
          *(undefined8 *)in_RDI[6].gcroot = *(undefined8 *)(in_RDI[8].gcroot + 0x10);
        }
        else {
          *(code **)&in_RDI[6].bc_cfunc_int = lj_vm_rethook;
          *(code **)&in_RDI[6].cur_L = lj_vm_rethook;
          *(code **)&in_RDI[6].jit_base = lj_vm_rethook;
          *(code **)in_RDI[6].gcroot = lj_vm_rethook;
        }
      }
    }
    else if ((bVar7 & 4) == 0 && bVar4 == 0) {
      memcpy(__dest,in_RDI[7].gcroot + 10,0x2c8);
      if (bVar5 != 0) {
        *(code **)&in_RDI[6].bc_cfunc_int = lj_vm_rethook;
        *(code **)&in_RDI[6].cur_L = lj_vm_rethook;
        *(code **)&in_RDI[6].jit_base = lj_vm_rethook;
        *(code **)in_RDI[6].gcroot = lj_vm_rethook;
      }
    }
    else {
      if ((bVar3 & 0x40) == 0) {
        local_58 = lj_vm_inshook;
        if ((bVar2 & 0x20) != 0) {
          local_58 = lj_vm_record;
        }
      }
      else {
        local_58 = lj_vm_profhook;
      }
      for (local_4c = 0; local_4c < 0x59; local_4c = local_4c + 1) {
        *(code **)(__dest + (ulong)local_4c * 2) = local_58;
      }
    }
    if (((bVar1 ^ bVar8) & 1) != 0) {
      if ((bVar2 & 1) != 0 || bVar10) {
        for (local_50 = 0x59; local_50 < 0x9a; local_50 = local_50 + 1) {
          *(code **)(__dest + (ulong)local_50 * 2) = lj_vm_callhook;
        }
      }
      else {
        for (local_50 = 0x59; local_50 < 0x9a; local_50 = local_50 + 1) {
          *(code **)(__dest + (ulong)local_50 * 2) = lj_BC_ISLT + (int)(uint)lj_bc_ofs[local_50];
        }
      }
    }
    if ((bVar2 & 1) == 0 && !bVar10) {
      *(code **)(in_RDI[6].gcroot + 0x1a) = local_38;
      *(code **)(in_RDI[6].gcroot + 0x20) = lj_BC_IFUNCV;
    }
    if ((bVar9 != 0) && ((bVar1 & 0x10) == 0)) {
      lj_dispatch_init_hotcount(in_RDI);
    }
  }
  return;
}

Assistant:

void lj_dispatch_update(global_State *g)
{
  uint8_t oldmode = g->dispatchmode;
  uint8_t mode = 0;
#if LJ_HASJIT
  mode |= (G2J(g)->flags & JIT_F_ON) ? DISPMODE_JIT : 0;
  mode |= G2J(g)->state != LJ_TRACE_IDLE ?
	    (DISPMODE_REC|DISPMODE_INS|DISPMODE_CALL) : 0;
#endif
#if LJ_HASPROFILE
  mode |= (g->hookmask & HOOK_PROFILE) ? (DISPMODE_PROF|DISPMODE_INS) : 0;
#endif
  mode |= (g->hookmask & (LUA_MASKLINE|LUA_MASKCOUNT)) ? DISPMODE_INS : 0;
  mode |= (g->hookmask & LUA_MASKCALL) ? DISPMODE_CALL : 0;
  mode |= (g->hookmask & LUA_MASKRET) ? DISPMODE_RET : 0;
  if (oldmode != mode) {  /* Mode changed? */
    ASMFunction *disp = G2GG(g)->dispatch;
    ASMFunction f_forl, f_iterl, f_loop, f_funcf, f_funcv;
    g->dispatchmode = mode;

    /* Hotcount if JIT is on, but not while recording. */
    if ((mode & (DISPMODE_JIT|DISPMODE_REC)) == DISPMODE_JIT) {
      f_forl = makeasmfunc(lj_bc_ofs[BC_FORL]);
      f_iterl = makeasmfunc(lj_bc_ofs[BC_ITERL]);
      f_loop = makeasmfunc(lj_bc_ofs[BC_LOOP]);
      f_funcf = makeasmfunc(lj_bc_ofs[BC_FUNCF]);
      f_funcv = makeasmfunc(lj_bc_ofs[BC_FUNCV]);
    } else {  /* Otherwise use the non-hotcounting instructions. */
      f_forl = disp[GG_LEN_DDISP+BC_IFORL];
      f_iterl = disp[GG_LEN_DDISP+BC_IITERL];
      f_loop = disp[GG_LEN_DDISP+BC_ILOOP];
      f_funcf = makeasmfunc(lj_bc_ofs[BC_IFUNCF]);
      f_funcv = makeasmfunc(lj_bc_ofs[BC_IFUNCV]);
    }
    /* Init static counting instruction dispatch first (may be copied below). */
    disp[GG_LEN_DDISP+BC_FORL] = f_forl;
    disp[GG_LEN_DDISP+BC_ITERL] = f_iterl;
    disp[GG_LEN_DDISP+BC_LOOP] = f_loop;

    /* Set dynamic instruction dispatch. */
    if ((oldmode ^ mode) & (DISPMODE_PROF|DISPMODE_REC|DISPMODE_INS)) {
      /* Need to update the whole table. */
      if (!(mode & DISPMODE_INS)) {  /* No ins dispatch? */
	/* Copy static dispatch table to dynamic dispatch table. */
	memcpy(&disp[0], &disp[GG_LEN_DDISP], GG_LEN_SDISP*sizeof(ASMFunction));
	/* Overwrite with dynamic return dispatch. */
	if ((mode & DISPMODE_RET)) {
	  disp[BC_RETM] = lj_vm_rethook;
	  disp[BC_RET] = lj_vm_rethook;
	  disp[BC_RET0] = lj_vm_rethook;
	  disp[BC_RET1] = lj_vm_rethook;
	}
      } else {
	/* The recording dispatch also checks for hooks. */
	ASMFunction f = (mode & DISPMODE_PROF) ? lj_vm_profhook :
			(mode & DISPMODE_REC) ? lj_vm_record : lj_vm_inshook;
	uint32_t i;
	for (i = 0; i < GG_LEN_SDISP; i++)
	  disp[i] = f;
      }
    } else if (!(mode & DISPMODE_INS)) {
      /* Otherwise set dynamic counting ins. */
      disp[BC_FORL] = f_forl;
      disp[BC_ITERL] = f_iterl;
      disp[BC_LOOP] = f_loop;
      /* Set dynamic return dispatch. */
      if ((mode & DISPMODE_RET)) {
	disp[BC_RETM] = lj_vm_rethook;
	disp[BC_RET] = lj_vm_rethook;
	disp[BC_RET0] = lj_vm_rethook;
	disp[BC_RET1] = lj_vm_rethook;
      } else {
	disp[BC_RETM] = disp[GG_LEN_DDISP+BC_RETM];
	disp[BC_RET] = disp[GG_LEN_DDISP+BC_RET];
	disp[BC_RET0] = disp[GG_LEN_DDISP+BC_RET0];
	disp[BC_RET1] = disp[GG_LEN_DDISP+BC_RET1];
      }
    }

    /* Set dynamic call dispatch. */
    if ((oldmode ^ mode) & DISPMODE_CALL) {  /* Update the whole table? */
      uint32_t i;
      if ((mode & DISPMODE_CALL) == 0) {  /* No call hooks? */
	for (i = GG_LEN_SDISP; i < GG_LEN_DDISP; i++)
	  disp[i] = makeasmfunc(lj_bc_ofs[i]);
      } else {
	for (i = GG_LEN_SDISP; i < GG_LEN_DDISP; i++)
	  disp[i] = lj_vm_callhook;
      }
    }
    if (!(mode & DISPMODE_CALL)) {  /* Overwrite dynamic counting ins. */
      disp[BC_FUNCF] = f_funcf;
      disp[BC_FUNCV] = f_funcv;
    }

#if LJ_HASJIT
    /* Reset hotcounts for JIT off to on transition. */
    if ((mode & DISPMODE_JIT) && !(oldmode & DISPMODE_JIT))
      lj_dispatch_init_hotcount(g);
#endif
  }
}